

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O2

PipelineCreateInfo * __thiscall
vkt::Draw::PipelineCreateInfo::addState
          (PipelineCreateInfo *this,VkPipelineViewportStateCreateInfo *state)

{
  pointer pVVar1;
  void *pvVar2;
  VkViewport *pVVar3;
  deUint32 dVar4;
  undefined4 uVar5;
  VkStructureType VVar6;
  undefined4 uVar7;
  allocator_type local_31;
  vector<vk::VkViewport,std::allocator<vk::VkViewport>> local_30 [24];
  
  std::vector<vk::VkViewport,std::allocator<vk::VkViewport>>::vector<vk::VkViewport_const*,void>
            (local_30,state->pViewports,state->pViewports + state->viewportCount,&local_31);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::_M_move_assign
            (&this->m_viewports,local_30);
  std::_Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>::~_Vector_base
            ((_Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_> *)local_30);
  std::vector<vk::VkRect2D,std::allocator<vk::VkRect2D>>::vector<vk::VkRect2D_const*,void>
            ((vector<vk::VkRect2D,std::allocator<vk::VkRect2D>> *)local_30,state->pScissors,
             state->pScissors + state->scissorCount,(allocator_type *)&local_31);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::_M_move_assign
            (&this->m_scissors,(vector<vk::VkRect2D,std::allocator<vk::VkRect2D>> *)local_30);
  std::_Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::~_Vector_base
            ((_Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> *)local_30);
  VVar6 = state->sType;
  uVar7 = *(undefined4 *)&state->field_0x4;
  pvVar2 = state->pNext;
  dVar4 = state->viewportCount;
  pVVar3 = state->pViewports;
  (this->m_viewportState).flags = state->flags;
  (this->m_viewportState).viewportCount = dVar4;
  (this->m_viewportState).pViewports = pVVar3;
  uVar5 = *(undefined4 *)&state->field_0x24;
  (this->m_viewportState).scissorCount = state->scissorCount;
  *(undefined4 *)&(this->m_viewportState).field_0x24 = uVar5;
  (this->m_viewportState).sType = VVar6;
  *(undefined4 *)&(this->m_viewportState).field_0x4 = uVar7;
  (this->m_viewportState).pNext = pvVar2;
  pVVar1 = (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->m_viewportState).pViewports =
       (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->m_viewportState).pScissors = pVVar1;
  (this->super_VkGraphicsPipelineCreateInfo).pViewportState = &this->m_viewportState;
  return this;
}

Assistant:

PipelineCreateInfo& PipelineCreateInfo::addState (const vk::VkPipelineViewportStateCreateInfo& state)
{
	m_viewports					= std::vector<vk::VkViewport>(state.pViewports, state.pViewports + state.viewportCount);
	m_scissors					= std::vector<vk::VkRect2D>(state.pScissors, state.pScissors + state.scissorCount);
	m_viewportState				= state;
	m_viewportState.pViewports	= &m_viewports[0];
	m_viewportState.pScissors	= &m_scissors[0];
	pViewportState				= &m_viewportState;

	return *this;
}